

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  bool bVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  int iVar27;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 (*pauVar28) [64];
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar48 [32];
  
  iVar27 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  auVar51 = vbroadcastss_avx512f(ZEXT416(0x80000000));
  auVar52 = vxorps_avx512dq(auVar51,(undefined1  [64])::_ps512_cephes_exp_C1);
  auVar53 = vxorps_avx512dq(auVar51,(undefined1  [64])::_ps512_cephes_exp_C2);
  auVar51 = vxorps_avx512dq(auVar51,(undefined1  [64])::_ps512_cephes_exp_p5);
  uVar31 = 0;
  uVar30 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar30 = uVar31;
  }
  for (; uVar31 != uVar30; uVar31 = uVar31 + 1) {
    pauVar28 = (undefined1 (*) [64])
               (bottom_top_blob->cstep * uVar31 * bottom_top_blob->elemsize +
               (long)bottom_top_blob->data);
    for (iVar29 = 0; iVar29 + 0xf < iVar27; iVar29 = iVar29 + 0x10) {
      auVar54 = vminps_avx512f(*pauVar28,(undefined1  [64])::_ps512_exp_hi);
      auVar54 = vmaxps_avx512f(auVar54,(undefined1  [64])::_ps512_exp_lo);
      auVar55 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar54,
                                    (undefined1  [64])::_ps512_cephes_exp_p5);
      auVar56 = vrndscaleps_avx512f(auVar55,1);
      uVar5 = vcmpps_avx512f(auVar55,auVar56,1);
      auVar55 = vsubps_avx512f(auVar56,(undefined1  [64])::_ps512_1);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar57._0_4_ = (uint)bVar3 * auVar55._0_4_ | (uint)!bVar3 * auVar56._0_4_;
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar3 * auVar55._4_4_ | (uint)!bVar3 * auVar56._4_4_;
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar3 * auVar55._8_4_ | (uint)!bVar3 * auVar56._8_4_;
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar3 * auVar55._12_4_ | (uint)!bVar3 * auVar56._12_4_;
      bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar57._16_4_ = (uint)bVar3 * auVar55._16_4_ | (uint)!bVar3 * auVar56._16_4_;
      bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar57._20_4_ = (uint)bVar3 * auVar55._20_4_ | (uint)!bVar3 * auVar56._20_4_;
      bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar57._24_4_ = (uint)bVar3 * auVar55._24_4_ | (uint)!bVar3 * auVar56._24_4_;
      bVar3 = (bool)((byte)(uVar5 >> 7) & 1);
      auVar57._28_4_ = (uint)bVar3 * auVar55._28_4_ | (uint)!bVar3 * auVar56._28_4_;
      bVar3 = (bool)((byte)(uVar5 >> 8) & 1);
      auVar57._32_4_ = (uint)bVar3 * auVar55._32_4_ | (uint)!bVar3 * auVar56._32_4_;
      bVar3 = (bool)((byte)(uVar5 >> 9) & 1);
      auVar57._36_4_ = (uint)bVar3 * auVar55._36_4_ | (uint)!bVar3 * auVar56._36_4_;
      bVar3 = (bool)((byte)(uVar5 >> 10) & 1);
      auVar57._40_4_ = (uint)bVar3 * auVar55._40_4_ | (uint)!bVar3 * auVar56._40_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xb) & 1);
      auVar57._44_4_ = (uint)bVar3 * auVar55._44_4_ | (uint)!bVar3 * auVar56._44_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xc) & 1);
      auVar57._48_4_ = (uint)bVar3 * auVar55._48_4_ | (uint)!bVar3 * auVar56._48_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xd) & 1);
      auVar57._52_4_ = (uint)bVar3 * auVar55._52_4_ | (uint)!bVar3 * auVar56._52_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xe) & 1);
      auVar57._56_4_ = (uint)bVar3 * auVar55._56_4_ | (uint)!bVar3 * auVar56._56_4_;
      bVar3 = SUB81(uVar5 >> 0xf,0);
      auVar57._60_4_ = (uint)bVar3 * auVar55._60_4_ | (uint)!bVar3 * auVar56._60_4_;
      auVar54 = vfmadd231ps_avx512f(auVar54,auVar57,auVar52);
      auVar54 = vfmadd231ps_avx512f(auVar54,auVar57,auVar53);
      auVar55 = vmulps_avx512f(auVar54,auVar54);
      auVar56 = vfmadd213ps_avx512f(auVar54,(undefined1  [64])::_ps512_cephes_exp_p0,
                                    (undefined1  [64])::_ps512_cephes_exp_p1);
      auVar56 = vfmadd213ps_avx512f(auVar56,auVar54,(undefined1  [64])::_ps512_cephes_exp_p2);
      auVar56 = vfmadd213ps_avx512f(auVar56,auVar54,(undefined1  [64])::_ps512_cephes_exp_p3);
      auVar56 = vfmadd213ps_avx512f(auVar56,auVar54,(undefined1  [64])::_ps512_cephes_exp_p4);
      auVar56 = vfmadd213ps_avx512f(auVar56,auVar54,(undefined1  [64])::_ps512_cephes_exp_p5);
      auVar54 = vfmadd213ps_avx512f(auVar56,auVar55,auVar54);
      auVar54 = vaddps_avx512f(auVar54,(undefined1  [64])::_ps512_1);
      auVar55 = vcvttps2dq_avx512f(auVar57);
      auVar56 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar55 = vpaddd_avx512f(auVar56,auVar55);
      auVar55 = vpslld_avx512f(auVar55,0x17);
      auVar57 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar54 = vfmadd213ps_avx512f(auVar55,auVar54,auVar57);
      auVar55 = vmaxps_avx512f(auVar54,(undefined1  [64])_ps512_min_norm_pos);
      auVar58 = vpsrld_avx512f(auVar55,0x17);
      auVar55 = vpternlogd_avx512f(auVar55,(undefined1  [64])::_ps512_cephes_exp_p5,
                                   (undefined1  [64])_ps512_inv_mant_mask,0xec);
      uVar5 = vcmpps_avx512f(auVar55,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar59 = vsubps_avx512f(auVar55,(undefined1  [64])::_ps512_1);
      auVar55 = vaddps_avx512f(auVar59,auVar55);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar60._0_4_ = (uint)bVar3 * auVar55._0_4_ | (uint)!bVar3 * auVar59._0_4_;
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar60._4_4_ = (uint)bVar3 * auVar55._4_4_ | (uint)!bVar3 * auVar59._4_4_;
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar60._8_4_ = (uint)bVar3 * auVar55._8_4_ | (uint)!bVar3 * auVar59._8_4_;
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar60._12_4_ = (uint)bVar3 * auVar55._12_4_ | (uint)!bVar3 * auVar59._12_4_;
      bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar60._16_4_ = (uint)bVar3 * auVar55._16_4_ | (uint)!bVar3 * auVar59._16_4_;
      bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar60._20_4_ = (uint)bVar3 * auVar55._20_4_ | (uint)!bVar3 * auVar59._20_4_;
      bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar60._24_4_ = (uint)bVar3 * auVar55._24_4_ | (uint)!bVar3 * auVar59._24_4_;
      bVar3 = (bool)((byte)(uVar5 >> 7) & 1);
      auVar60._28_4_ = (uint)bVar3 * auVar55._28_4_ | (uint)!bVar3 * auVar59._28_4_;
      bVar4 = (byte)(uVar5 >> 8);
      bVar3 = (bool)(bVar4 & 1);
      auVar60._32_4_ = (uint)bVar3 * auVar55._32_4_ | (uint)!bVar3 * auVar59._32_4_;
      bVar3 = (bool)((byte)(uVar5 >> 9) & 1);
      auVar60._36_4_ = (uint)bVar3 * auVar55._36_4_ | (uint)!bVar3 * auVar59._36_4_;
      bVar3 = (bool)((byte)(uVar5 >> 10) & 1);
      auVar60._40_4_ = (uint)bVar3 * auVar55._40_4_ | (uint)!bVar3 * auVar59._40_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xb) & 1);
      auVar60._44_4_ = (uint)bVar3 * auVar55._44_4_ | (uint)!bVar3 * auVar59._44_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xc) & 1);
      auVar60._48_4_ = (uint)bVar3 * auVar55._48_4_ | (uint)!bVar3 * auVar59._48_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xd) & 1);
      auVar60._52_4_ = (uint)bVar3 * auVar55._52_4_ | (uint)!bVar3 * auVar59._52_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xe) & 1);
      auVar60._56_4_ = (uint)bVar3 * auVar55._56_4_ | (uint)!bVar3 * auVar59._56_4_;
      bVar3 = SUB81(uVar5 >> 0xf,0);
      auVar60._60_4_ = (uint)bVar3 * auVar55._60_4_ | (uint)!bVar3 * auVar59._60_4_;
      auVar55 = vmulps_avx512f(auVar60,auVar60);
      auVar59 = vfmadd132ps_avx512f(auVar60,(undefined1  [64])_ps512_cephes_log_p1,
                                    (undefined1  [64])_ps512_cephes_log_p0);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar60,(undefined1  [64])_ps512_cephes_log_p2);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar60,(undefined1  [64])_ps512_cephes_log_p3);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar60,(undefined1  [64])_ps512_cephes_log_p4);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar60,(undefined1  [64])_ps512_cephes_log_p5);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar60,(undefined1  [64])_ps512_cephes_log_p6);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar60,(undefined1  [64])_ps512_cephes_log_p7);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar60,(undefined1  [64])_ps512_cephes_log_p8);
      auVar61 = vmulps_avx512f(auVar55,auVar60);
      auVar59 = vfmadd213ps_avx512f(auVar61,auVar59,auVar60);
      uVar6 = vcmpps_avx512f(auVar54,_DAT_00543780,2);
      auVar54 = vpsubd_avx512f(auVar58,auVar56);
      auVar54 = vcvtdq2ps_avx512f(auVar54);
      auVar58 = vaddps_avx512f(auVar54,(undefined1  [64])::_ps512_1);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar61._0_4_ = (uint)bVar3 * auVar54._0_4_ | (uint)!bVar3 * auVar58._0_4_;
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar61._4_4_ = (uint)bVar3 * auVar54._4_4_ | (uint)!bVar3 * auVar58._4_4_;
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar61._8_4_ = (uint)bVar3 * auVar54._8_4_ | (uint)!bVar3 * auVar58._8_4_;
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar61._12_4_ = (uint)bVar3 * auVar54._12_4_ | (uint)!bVar3 * auVar58._12_4_;
      bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar61._16_4_ = (uint)bVar3 * auVar54._16_4_ | (uint)!bVar3 * auVar58._16_4_;
      bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar61._20_4_ = (uint)bVar3 * auVar54._20_4_ | (uint)!bVar3 * auVar58._20_4_;
      bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar61._24_4_ = (uint)bVar3 * auVar54._24_4_ | (uint)!bVar3 * auVar58._24_4_;
      bVar3 = (bool)((byte)(uVar5 >> 7) & 1);
      auVar61._28_4_ = (uint)bVar3 * auVar54._28_4_ | (uint)!bVar3 * auVar58._28_4_;
      bVar3 = (bool)(bVar4 & 1);
      auVar61._32_4_ = (uint)bVar3 * auVar54._32_4_ | (uint)!bVar3 * auVar58._32_4_;
      bVar3 = (bool)((byte)(uVar5 >> 9) & 1);
      auVar61._36_4_ = (uint)bVar3 * auVar54._36_4_ | (uint)!bVar3 * auVar58._36_4_;
      bVar3 = (bool)((byte)(uVar5 >> 10) & 1);
      auVar61._40_4_ = (uint)bVar3 * auVar54._40_4_ | (uint)!bVar3 * auVar58._40_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xb) & 1);
      auVar61._44_4_ = (uint)bVar3 * auVar54._44_4_ | (uint)!bVar3 * auVar58._44_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xc) & 1);
      auVar61._48_4_ = (uint)bVar3 * auVar54._48_4_ | (uint)!bVar3 * auVar58._48_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xd) & 1);
      auVar61._52_4_ = (uint)bVar3 * auVar54._52_4_ | (uint)!bVar3 * auVar58._52_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xe) & 1);
      auVar61._56_4_ = (uint)bVar3 * auVar54._56_4_ | (uint)!bVar3 * auVar58._56_4_;
      bVar3 = SUB81(uVar5 >> 0xf,0);
      auVar61._60_4_ = (uint)bVar3 * auVar54._60_4_ | (uint)!bVar3 * auVar58._60_4_;
      auVar54 = vfmadd231ps_avx512f(auVar59,auVar61,(undefined1  [64])::_ps512_cephes_exp_C2);
      auVar54 = vfmadd231ps_avx512f(auVar54,auVar55,auVar51);
      auVar54 = vfmadd231ps_avx512f(auVar54,auVar61,(undefined1  [64])::_ps512_cephes_exp_C1);
      auVar55 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
      auVar54 = vmulps_avx512f(auVar54,auVar55);
      auVar58 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      bVar3 = (bool)((byte)uVar6 & 1);
      auVar59._0_4_ = (uint)bVar3 * auVar58._0_4_ | (uint)!bVar3 * auVar54._0_4_;
      bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar59._4_4_ = (uint)bVar3 * auVar58._4_4_ | (uint)!bVar3 * auVar54._4_4_;
      bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar59._8_4_ = (uint)bVar3 * auVar58._8_4_ | (uint)!bVar3 * auVar54._8_4_;
      bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar59._12_4_ = (uint)bVar3 * auVar58._12_4_ | (uint)!bVar3 * auVar54._12_4_;
      bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
      auVar59._16_4_ = (uint)bVar3 * auVar58._16_4_ | (uint)!bVar3 * auVar54._16_4_;
      bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
      auVar59._20_4_ = (uint)bVar3 * auVar58._20_4_ | (uint)!bVar3 * auVar54._20_4_;
      bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
      auVar59._24_4_ = (uint)bVar3 * auVar58._24_4_ | (uint)!bVar3 * auVar54._24_4_;
      bVar3 = (bool)((byte)(uVar6 >> 7) & 1);
      auVar59._28_4_ = (uint)bVar3 * auVar58._28_4_ | (uint)!bVar3 * auVar54._28_4_;
      bVar3 = (bool)((byte)(uVar6 >> 8) & 1);
      auVar59._32_4_ = (uint)bVar3 * auVar58._32_4_ | (uint)!bVar3 * auVar54._32_4_;
      bVar3 = (bool)((byte)(uVar6 >> 9) & 1);
      auVar59._36_4_ = (uint)bVar3 * auVar58._36_4_ | (uint)!bVar3 * auVar54._36_4_;
      bVar3 = (bool)((byte)(uVar6 >> 10) & 1);
      auVar59._40_4_ = (uint)bVar3 * auVar58._40_4_ | (uint)!bVar3 * auVar54._40_4_;
      bVar3 = (bool)((byte)(uVar6 >> 0xb) & 1);
      auVar59._44_4_ = (uint)bVar3 * auVar58._44_4_ | (uint)!bVar3 * auVar54._44_4_;
      bVar3 = (bool)((byte)(uVar6 >> 0xc) & 1);
      auVar59._48_4_ = (uint)bVar3 * auVar58._48_4_ | (uint)!bVar3 * auVar54._48_4_;
      bVar3 = (bool)((byte)(uVar6 >> 0xd) & 1);
      auVar59._52_4_ = (uint)bVar3 * auVar58._52_4_ | (uint)!bVar3 * auVar54._52_4_;
      bVar3 = (bool)((byte)(uVar6 >> 0xe) & 1);
      auVar59._56_4_ = (uint)bVar3 * auVar58._56_4_ | (uint)!bVar3 * auVar54._56_4_;
      bVar3 = SUB81(uVar6 >> 0xf,0);
      auVar59._60_4_ = (uint)bVar3 * auVar58._60_4_ | (uint)!bVar3 * auVar54._60_4_;
      auVar54 = vminps_avx512f(auVar59,(undefined1  [64])::_ps512_exp_hi);
      auVar54 = vmaxps_avx512f(auVar54,(undefined1  [64])::_ps512_exp_lo);
      auVar58 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar54,
                                    (undefined1  [64])::_ps512_cephes_exp_p5);
      auVar59 = vrndscaleps_avx512f(auVar58,1);
      uVar5 = vcmpps_avx512f(auVar58,auVar59,1);
      auVar58 = vsubps_avx512f(auVar59,(undefined1  [64])::_ps512_1);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar62._0_4_ = (uint)bVar3 * auVar58._0_4_ | (uint)!bVar3 * auVar59._0_4_;
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar62._4_4_ = (uint)bVar3 * auVar58._4_4_ | (uint)!bVar3 * auVar59._4_4_;
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar62._8_4_ = (uint)bVar3 * auVar58._8_4_ | (uint)!bVar3 * auVar59._8_4_;
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar62._12_4_ = (uint)bVar3 * auVar58._12_4_ | (uint)!bVar3 * auVar59._12_4_;
      bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar62._16_4_ = (uint)bVar3 * auVar58._16_4_ | (uint)!bVar3 * auVar59._16_4_;
      bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar62._20_4_ = (uint)bVar3 * auVar58._20_4_ | (uint)!bVar3 * auVar59._20_4_;
      bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar62._24_4_ = (uint)bVar3 * auVar58._24_4_ | (uint)!bVar3 * auVar59._24_4_;
      bVar3 = (bool)((byte)(uVar5 >> 7) & 1);
      auVar62._28_4_ = (uint)bVar3 * auVar58._28_4_ | (uint)!bVar3 * auVar59._28_4_;
      bVar3 = (bool)((byte)(uVar5 >> 8) & 1);
      auVar62._32_4_ = (uint)bVar3 * auVar58._32_4_ | (uint)!bVar3 * auVar59._32_4_;
      bVar3 = (bool)((byte)(uVar5 >> 9) & 1);
      auVar62._36_4_ = (uint)bVar3 * auVar58._36_4_ | (uint)!bVar3 * auVar59._36_4_;
      bVar3 = (bool)((byte)(uVar5 >> 10) & 1);
      auVar62._40_4_ = (uint)bVar3 * auVar58._40_4_ | (uint)!bVar3 * auVar59._40_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xb) & 1);
      auVar62._44_4_ = (uint)bVar3 * auVar58._44_4_ | (uint)!bVar3 * auVar59._44_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xc) & 1);
      auVar62._48_4_ = (uint)bVar3 * auVar58._48_4_ | (uint)!bVar3 * auVar59._48_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xd) & 1);
      auVar62._52_4_ = (uint)bVar3 * auVar58._52_4_ | (uint)!bVar3 * auVar59._52_4_;
      bVar3 = (bool)((byte)(uVar5 >> 0xe) & 1);
      auVar62._56_4_ = (uint)bVar3 * auVar58._56_4_ | (uint)!bVar3 * auVar59._56_4_;
      bVar3 = SUB81(uVar5 >> 0xf,0);
      auVar62._60_4_ = (uint)bVar3 * auVar58._60_4_ | (uint)!bVar3 * auVar59._60_4_;
      auVar54 = vfmadd231ps_avx512f(auVar54,auVar62,auVar52);
      auVar54 = vfmadd231ps_avx512f(auVar54,auVar62,auVar53);
      auVar58 = vmulps_avx512f(auVar54,auVar54);
      auVar59 = vfmadd213ps_avx512f(auVar54,(undefined1  [64])::_ps512_cephes_exp_p0,
                                    (undefined1  [64])::_ps512_cephes_exp_p1);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar54,(undefined1  [64])::_ps512_cephes_exp_p2);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar54,(undefined1  [64])::_ps512_cephes_exp_p3);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar54,(undefined1  [64])::_ps512_cephes_exp_p4);
      auVar59 = vfmadd213ps_avx512f(auVar59,auVar54,(undefined1  [64])::_ps512_cephes_exp_p5);
      auVar54 = vfmadd213ps_avx512f(auVar59,auVar58,auVar54);
      auVar54 = vaddps_avx512f(auVar54,(undefined1  [64])::_ps512_1);
      auVar58 = vcvttps2dq_avx512f(auVar62);
      auVar56 = vpaddd_avx512f(auVar58,auVar56);
      auVar56 = vpslld_avx512f(auVar56,0x17);
      auVar54 = vfmadd213ps_avx512f(auVar56,auVar54,auVar57);
      auVar54 = vdivps_avx512f(auVar57,auVar54);
      auVar54 = vfnmsub213ps_avx512f(auVar54,auVar55,auVar57);
      auVar54 = vmulps_avx512f(auVar54,*pauVar28);
      *pauVar28 = auVar54;
      pauVar28 = pauVar28 + 1;
    }
    for (; iVar29 + 7 < iVar27; iVar29 = iVar29 + 8) {
      auVar2 = *(undefined1 (*) [32])*pauVar28;
      auVar84._8_4_ = 0x42b0c0a5;
      auVar84._0_8_ = 0x42b0c0a542b0c0a5;
      auVar84._12_4_ = 0x42b0c0a5;
      auVar84._16_4_ = 0x42b0c0a5;
      auVar84._20_4_ = 0x42b0c0a5;
      auVar84._24_4_ = 0x42b0c0a5;
      auVar84._28_4_ = 0x42b0c0a5;
      auVar43 = vminps_avx(auVar2,auVar84);
      auVar86._8_4_ = 0xc2b0c0a5;
      auVar86._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar86._12_4_ = 0xc2b0c0a5;
      auVar86._16_4_ = 0xc2b0c0a5;
      auVar86._20_4_ = 0xc2b0c0a5;
      auVar86._24_4_ = 0xc2b0c0a5;
      auVar86._28_4_ = 0xc2b0c0a5;
      auVar43 = vmaxps_avx(auVar43,auVar86);
      auVar90._8_4_ = 0x3fb8aa3b;
      auVar90._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar90._12_4_ = 0x3fb8aa3b;
      auVar90._16_4_ = 0x3fb8aa3b;
      auVar90._20_4_ = 0x3fb8aa3b;
      auVar90._24_4_ = 0x3fb8aa3b;
      auVar90._28_4_ = 0x3fb8aa3b;
      auVar88._8_4_ = 0x3f000000;
      auVar88._0_8_ = 0x3f0000003f000000;
      auVar88._12_4_ = 0x3f000000;
      auVar88._16_4_ = 0x3f000000;
      auVar88._20_4_ = 0x3f000000;
      auVar88._24_4_ = 0x3f000000;
      auVar88._28_4_ = 0x3f000000;
      auVar1 = vfmadd213ps_fma(auVar90,auVar43,auVar88);
      auVar46 = vroundps_avx(ZEXT1632(auVar1),1);
      uVar5 = vcmpps_avx512vl(ZEXT1632(auVar1),auVar46,1);
      auVar92._8_4_ = 0x3f800000;
      auVar92._0_8_ = 0x3f8000003f800000;
      auVar92._12_4_ = 0x3f800000;
      auVar92._16_4_ = 0x3f800000;
      auVar92._20_4_ = 0x3f800000;
      auVar92._24_4_ = 0x3f800000;
      auVar92._28_4_ = 0x3f800000;
      auVar41 = vsubps_avx512vl(auVar46,auVar92);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar45._0_4_ = (float)((uint)bVar3 * auVar41._0_4_ | (uint)!bVar3 * auVar46._0_4_);
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar45._4_4_ = (float)((uint)bVar3 * auVar41._4_4_ | (uint)!bVar3 * auVar46._4_4_);
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar45._8_4_ = (float)((uint)bVar3 * auVar41._8_4_ | (uint)!bVar3 * auVar46._8_4_);
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar45._12_4_ = (float)((uint)bVar3 * auVar41._12_4_ | (uint)!bVar3 * auVar46._12_4_);
      bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar45._16_4_ = (float)((uint)bVar3 * auVar41._16_4_ | (uint)!bVar3 * auVar46._16_4_);
      bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar45._20_4_ = (float)((uint)bVar3 * auVar41._20_4_ | (uint)!bVar3 * auVar46._20_4_);
      bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar45._24_4_ = (float)((uint)bVar3 * auVar41._24_4_ | (uint)!bVar3 * auVar46._24_4_);
      bVar3 = SUB81(uVar5 >> 7,0);
      auVar45._28_4_ = (float)((uint)bVar3 * auVar41._28_4_ | (uint)!bVar3 * auVar46._28_4_);
      auVar94._8_4_ = 0x3f318000;
      auVar94._0_8_ = 0x3f3180003f318000;
      auVar94._12_4_ = 0x3f318000;
      auVar94._16_4_ = 0x3f318000;
      auVar94._20_4_ = 0x3f318000;
      auVar94._24_4_ = 0x3f318000;
      auVar94._28_4_ = 0x3f318000;
      auVar1 = vfmsub231ps_fma(auVar43,auVar45,auVar94);
      auVar96._8_4_ = 0xb95e8083;
      auVar96._0_8_ = 0xb95e8083b95e8083;
      auVar96._12_4_ = 0xb95e8083;
      auVar96._16_4_ = 0xb95e8083;
      auVar96._20_4_ = 0xb95e8083;
      auVar96._24_4_ = 0xb95e8083;
      auVar96._28_4_ = 0xb95e8083;
      auVar34 = vfnmsub231ps_fma(ZEXT1632(auVar1),auVar45,auVar96);
      auVar43 = ZEXT1632(auVar34);
      auVar100._8_4_ = 0x39506967;
      auVar100._0_8_ = 0x3950696739506967;
      auVar100._12_4_ = 0x39506967;
      auVar100._16_4_ = 0x39506967;
      auVar100._20_4_ = 0x39506967;
      auVar100._24_4_ = 0x39506967;
      auVar100._28_4_ = 0x39506967;
      auVar98._8_4_ = 0x3ab743ce;
      auVar98._0_8_ = 0x3ab743ce3ab743ce;
      auVar98._12_4_ = 0x3ab743ce;
      auVar98._16_4_ = 0x3ab743ce;
      auVar98._20_4_ = 0x3ab743ce;
      auVar98._24_4_ = 0x3ab743ce;
      auVar98._28_4_ = 0x3ab743ce;
      auVar1 = vfmadd213ps_fma(auVar100,auVar43,auVar98);
      auVar102._8_4_ = 0x3c088908;
      auVar102._0_8_ = 0x3c0889083c088908;
      auVar102._12_4_ = 0x3c088908;
      auVar102._16_4_ = 0x3c088908;
      auVar102._20_4_ = 0x3c088908;
      auVar102._24_4_ = 0x3c088908;
      auVar102._28_4_ = 0x3c088908;
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar1),auVar43,auVar102);
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar43 = vfmadd213ps_avx512vl(ZEXT1632(auVar1),auVar43,auVar42);
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar46 = ZEXT1632(auVar34);
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar46,auVar44);
      auVar1 = vfmadd213ps_fma(auVar43,auVar46,auVar88);
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar1),
                               ZEXT1632(CONCAT412(auVar34._12_4_ * auVar34._12_4_,
                                                  CONCAT48(auVar34._8_4_ * auVar34._8_4_,
                                                           CONCAT44(auVar34._4_4_ * auVar34._4_4_,
                                                                    auVar34._0_4_ * auVar34._0_4_)))
                                       ),auVar46);
      auVar66._0_4_ = auVar1._0_4_ + 1.0;
      auVar66._4_4_ = auVar1._4_4_ + 1.0;
      auVar66._8_4_ = auVar1._8_4_ + 1.0;
      auVar66._12_4_ = auVar1._12_4_ + 1.0;
      auVar66._16_4_ = 0x3f800000;
      auVar66._20_4_ = 0x3f800000;
      auVar66._24_4_ = 0x3f800000;
      auVar66._28_4_ = 0x3f800000;
      auVar72._0_4_ = (int)auVar45._0_4_;
      auVar72._4_4_ = (int)auVar45._4_4_;
      auVar72._8_4_ = (int)auVar45._8_4_;
      auVar72._12_4_ = (int)auVar45._12_4_;
      auVar72._16_4_ = (int)auVar45._16_4_;
      auVar72._20_4_ = (int)auVar45._20_4_;
      auVar72._24_4_ = (int)auVar45._24_4_;
      auVar72._28_4_ = (int)auVar45._28_4_;
      auVar43 = vpslld_avx2(auVar72,0x17);
      auVar45 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar43 = vpaddd_avx512vl(auVar43,auVar45);
      auVar1 = vfmadd213ps_fma(auVar43,auVar66,auVar92);
      uVar5 = vcmpps_avx512vl(ZEXT1632(auVar1),_DAT_0053ad80,2);
      auVar43._8_4_ = 0x800000;
      auVar43._0_8_ = 0x80000000800000;
      auVar43._12_4_ = 0x800000;
      auVar43._16_4_ = 0x800000;
      auVar43._20_4_ = 0x800000;
      auVar43._24_4_ = 0x800000;
      auVar43._28_4_ = 0x800000;
      auVar43 = vmaxps_avx512vl(ZEXT1632(auVar1),auVar43);
      auVar73 = vpsrld_avx2(auVar43,0x17);
      auVar78._8_4_ = 0x807fffff;
      auVar78._0_8_ = 0x807fffff807fffff;
      auVar78._12_4_ = 0x807fffff;
      auVar78._16_4_ = 0x807fffff;
      auVar78._20_4_ = 0x807fffff;
      auVar78._24_4_ = 0x807fffff;
      auVar78._28_4_ = 0x807fffff;
      auVar46._8_4_ = 0x3f000000;
      auVar46._0_8_ = 0x3f0000003f000000;
      auVar46._12_4_ = 0x3f000000;
      auVar46._16_4_ = 0x3f000000;
      auVar46._20_4_ = 0x3f000000;
      auVar46._24_4_ = 0x3f000000;
      auVar46._28_4_ = 0x3f000000;
      auVar43 = vpternlogd_avx512vl(auVar43,auVar78,auVar46,0xea);
      auVar41._8_4_ = 0x3f3504f3;
      auVar41._0_8_ = 0x3f3504f33f3504f3;
      auVar41._12_4_ = 0x3f3504f3;
      auVar41._16_4_ = 0x3f3504f3;
      auVar41._20_4_ = 0x3f3504f3;
      auVar41._24_4_ = 0x3f3504f3;
      auVar41._28_4_ = 0x3f3504f3;
      uVar6 = vcmpps_avx512vl(auVar43,auVar41,1);
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar46 = vaddps_avx512vl(auVar43,auVar41);
      auVar47 = vaddps_avx512vl(auVar46,auVar43);
      bVar3 = (bool)((byte)uVar6 & 1);
      auVar48._0_4_ = (float)((uint)bVar3 * auVar47._0_4_ | (uint)!bVar3 * auVar46._0_4_);
      bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar48._4_4_ = (float)((uint)bVar3 * auVar47._4_4_ | (uint)!bVar3 * auVar46._4_4_);
      bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar48._8_4_ = (float)((uint)bVar3 * auVar47._8_4_ | (uint)!bVar3 * auVar46._8_4_);
      bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar48._12_4_ = (float)((uint)bVar3 * auVar47._12_4_ | (uint)!bVar3 * auVar46._12_4_);
      bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
      auVar48._16_4_ = (float)((uint)bVar3 * auVar47._16_4_ | (uint)!bVar3 * auVar46._16_4_);
      bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
      auVar48._20_4_ = (float)((uint)bVar3 * auVar47._20_4_ | (uint)!bVar3 * auVar46._20_4_);
      bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
      auVar48._24_4_ = (float)((uint)bVar3 * auVar47._24_4_ | (uint)!bVar3 * auVar46._24_4_);
      bVar3 = SUB81(uVar6 >> 7,0);
      auVar48._28_4_ = (uint)bVar3 * auVar47._28_4_ | (uint)!bVar3 * auVar46._28_4_;
      auVar25._4_4_ = auVar48._4_4_ * auVar48._4_4_;
      auVar25._0_4_ = auVar48._0_4_ * auVar48._0_4_;
      auVar25._8_4_ = auVar48._8_4_ * auVar48._8_4_;
      auVar25._12_4_ = auVar48._12_4_ * auVar48._12_4_;
      auVar25._16_4_ = auVar48._16_4_ * auVar48._16_4_;
      auVar25._20_4_ = auVar48._20_4_ * auVar48._20_4_;
      auVar25._24_4_ = auVar48._24_4_ * auVar48._24_4_;
      auVar25._28_4_ = auVar43._28_4_;
      auVar81._8_4_ = 0x3d9021bb;
      auVar81._0_8_ = 0x3d9021bb3d9021bb;
      auVar81._12_4_ = 0x3d9021bb;
      auVar81._16_4_ = 0x3d9021bb;
      auVar81._20_4_ = 0x3d9021bb;
      auVar81._24_4_ = 0x3d9021bb;
      auVar81._28_4_ = 0x3d9021bb;
      auVar47._8_4_ = 0xbdebd1b8;
      auVar47._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar47._12_4_ = 0xbdebd1b8;
      auVar47._16_4_ = 0xbdebd1b8;
      auVar47._20_4_ = 0xbdebd1b8;
      auVar47._24_4_ = 0xbdebd1b8;
      auVar47._28_4_ = 0xbdebd1b8;
      auVar43 = vfmadd213ps_avx512vl(auVar81,auVar48,auVar47);
      auVar17._8_4_ = 0x3def251a;
      auVar17._0_8_ = 0x3def251a3def251a;
      auVar17._12_4_ = 0x3def251a;
      auVar17._16_4_ = 0x3def251a;
      auVar17._20_4_ = 0x3def251a;
      auVar17._24_4_ = 0x3def251a;
      auVar17._28_4_ = 0x3def251a;
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar48,auVar17);
      auVar18._8_4_ = 0xbdfe5d4f;
      auVar18._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar18._12_4_ = 0xbdfe5d4f;
      auVar18._16_4_ = 0xbdfe5d4f;
      auVar18._20_4_ = 0xbdfe5d4f;
      auVar18._24_4_ = 0xbdfe5d4f;
      auVar18._28_4_ = 0xbdfe5d4f;
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar48,auVar18);
      auVar19._8_4_ = 0x3e11e9bf;
      auVar19._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar19._12_4_ = 0x3e11e9bf;
      auVar19._16_4_ = 0x3e11e9bf;
      auVar19._20_4_ = 0x3e11e9bf;
      auVar19._24_4_ = 0x3e11e9bf;
      auVar19._28_4_ = 0x3e11e9bf;
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar48,auVar19);
      auVar20._8_4_ = 0xbe2aae50;
      auVar20._0_8_ = 0xbe2aae50be2aae50;
      auVar20._12_4_ = 0xbe2aae50;
      auVar20._16_4_ = 0xbe2aae50;
      auVar20._20_4_ = 0xbe2aae50;
      auVar20._24_4_ = 0xbe2aae50;
      auVar20._28_4_ = 0xbe2aae50;
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar48,auVar20);
      auVar21._8_4_ = 0x3e4cceac;
      auVar21._0_8_ = 0x3e4cceac3e4cceac;
      auVar21._12_4_ = 0x3e4cceac;
      auVar21._16_4_ = 0x3e4cceac;
      auVar21._20_4_ = 0x3e4cceac;
      auVar21._24_4_ = 0x3e4cceac;
      auVar21._28_4_ = 0x3e4cceac;
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar48,auVar21);
      auVar22._8_4_ = 0xbe7ffffc;
      auVar22._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar22._12_4_ = 0xbe7ffffc;
      auVar22._16_4_ = 0xbe7ffffc;
      auVar22._20_4_ = 0xbe7ffffc;
      auVar22._24_4_ = 0xbe7ffffc;
      auVar22._28_4_ = 0xbe7ffffc;
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar48,auVar22);
      auVar23._8_4_ = 0x3eaaaaaa;
      auVar23._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar23._12_4_ = 0x3eaaaaaa;
      auVar23._16_4_ = 0x3eaaaaaa;
      auVar23._20_4_ = 0x3eaaaaaa;
      auVar23._24_4_ = 0x3eaaaaaa;
      auVar23._28_4_ = 0x3eaaaaaa;
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar48,auVar23);
      auVar26._4_4_ = auVar48._4_4_ * auVar48._4_4_ * auVar48._4_4_ * auVar43._4_4_;
      auVar26._0_4_ = auVar48._0_4_ * auVar48._0_4_ * auVar48._0_4_ * auVar43._0_4_;
      auVar26._8_4_ = auVar48._8_4_ * auVar48._8_4_ * auVar48._8_4_ * auVar43._8_4_;
      auVar26._12_4_ = auVar48._12_4_ * auVar48._12_4_ * auVar48._12_4_ * auVar43._12_4_;
      auVar26._16_4_ = auVar48._16_4_ * auVar48._16_4_ * auVar48._16_4_ * auVar43._16_4_;
      auVar26._20_4_ = auVar48._20_4_ * auVar48._20_4_ * auVar48._20_4_ * auVar43._20_4_;
      auVar26._24_4_ = auVar48._24_4_ * auVar48._24_4_ * auVar48._24_4_ * auVar43._24_4_;
      auVar26._28_4_ = auVar43._28_4_;
      auVar24._8_4_ = 0xffffff82;
      auVar24._0_8_ = 0xffffff82ffffff82;
      auVar24._12_4_ = 0xffffff82;
      auVar24._16_4_ = 0xffffff82;
      auVar24._20_4_ = 0xffffff82;
      auVar24._24_4_ = 0xffffff82;
      auVar24._28_4_ = 0xffffff82;
      auVar43 = vpaddd_avx512vl(auVar73,auVar24);
      auVar43 = vcvtdq2ps_avx(auVar43);
      auVar46 = vsubps_avx512vl(auVar43,auVar92);
      bVar3 = (bool)((byte)uVar6 & 1);
      auVar73._0_4_ = (uint)bVar3 * auVar46._0_4_ | (uint)!bVar3 * auVar43._0_4_;
      bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar73._4_4_ = (uint)bVar3 * auVar46._4_4_ | (uint)!bVar3 * auVar43._4_4_;
      bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar73._8_4_ = (uint)bVar3 * auVar46._8_4_ | (uint)!bVar3 * auVar43._8_4_;
      bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar73._12_4_ = (uint)bVar3 * auVar46._12_4_ | (uint)!bVar3 * auVar43._12_4_;
      bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
      auVar73._16_4_ = (uint)bVar3 * auVar46._16_4_ | (uint)!bVar3 * auVar43._16_4_;
      bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
      auVar73._20_4_ = (uint)bVar3 * auVar46._20_4_ | (uint)!bVar3 * auVar43._20_4_;
      bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
      auVar73._24_4_ = (uint)bVar3 * auVar46._24_4_ | (uint)!bVar3 * auVar43._24_4_;
      bVar3 = SUB81(uVar6 >> 7,0);
      auVar73._28_4_ = (uint)bVar3 * auVar46._28_4_ | (uint)!bVar3 * auVar43._28_4_;
      auVar1 = vfmadd231ps_fma(auVar26,auVar73,auVar96);
      auVar1 = vfmsub231ps_fma(ZEXT1632(auVar1),auVar88,auVar25);
      auVar43 = vsubps_avx(ZEXT1632(auVar1),auVar48);
      auVar1 = vfmsub231ps_fma(auVar43,auVar94,auVar73);
      auVar82._8_4_ = 0xc0000000;
      auVar82._0_8_ = 0xc0000000c0000000;
      auVar82._12_4_ = 0xc0000000;
      auVar82._16_4_ = 0xc0000000;
      auVar82._20_4_ = 0xc0000000;
      auVar82._24_4_ = 0xc0000000;
      auVar82._28_4_ = 0xc0000000;
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar49._0_4_ = (uint)bVar3 * auVar43._0_4_ | (uint)!bVar3 * (int)(auVar1._0_4_ * -2.0);
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar49._4_4_ = (uint)bVar3 * auVar43._4_4_ | (uint)!bVar3 * (int)(auVar1._4_4_ * -2.0);
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar49._8_4_ = (uint)bVar3 * auVar43._8_4_ | (uint)!bVar3 * (int)(auVar1._8_4_ * -2.0);
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar49._12_4_ = (uint)bVar3 * auVar43._12_4_ | (uint)!bVar3 * (int)(auVar1._12_4_ * -2.0);
      bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar49._16_4_ = (uint)bVar3 * auVar43._16_4_ | (uint)!bVar3 * -0x80000000;
      bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar49._20_4_ = (uint)bVar3 * auVar43._20_4_ | (uint)!bVar3 * -0x80000000;
      bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar49._24_4_ = (uint)bVar3 * auVar43._24_4_ | (uint)!bVar3 * -0x80000000;
      auVar49._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar43._28_4_;
      auVar43 = vminps_avx(auVar49,auVar84);
      auVar43 = vmaxps_avx(auVar43,auVar86);
      auVar1 = vfmadd213ps_fma(auVar90,auVar43,auVar88);
      auVar46 = vroundps_avx(ZEXT1632(auVar1),1);
      uVar5 = vcmpps_avx512vl(ZEXT1632(auVar1),auVar46,1);
      auVar47 = vsubps_avx512vl(auVar46,auVar92);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar50._0_4_ = (float)((uint)bVar3 * auVar47._0_4_ | (uint)!bVar3 * auVar46._0_4_);
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar50._4_4_ = (float)((uint)bVar3 * auVar47._4_4_ | (uint)!bVar3 * auVar46._4_4_);
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar50._8_4_ = (float)((uint)bVar3 * auVar47._8_4_ | (uint)!bVar3 * auVar46._8_4_);
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar50._12_4_ = (float)((uint)bVar3 * auVar47._12_4_ | (uint)!bVar3 * auVar46._12_4_);
      bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
      auVar50._16_4_ = (float)((uint)bVar3 * auVar47._16_4_ | (uint)!bVar3 * auVar46._16_4_);
      bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
      auVar50._20_4_ = (float)((uint)bVar3 * auVar47._20_4_ | (uint)!bVar3 * auVar46._20_4_);
      bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
      auVar50._24_4_ = (float)((uint)bVar3 * auVar47._24_4_ | (uint)!bVar3 * auVar46._24_4_);
      bVar3 = SUB81(uVar5 >> 7,0);
      auVar50._28_4_ = (float)((uint)bVar3 * auVar47._28_4_ | (uint)!bVar3 * auVar46._28_4_);
      auVar1 = vfmsub231ps_fma(auVar43,auVar50,auVar94);
      auVar34 = vfnmsub231ps_fma(ZEXT1632(auVar1),auVar50,auVar96);
      auVar43 = ZEXT1632(auVar34);
      auVar1 = vfmadd213ps_fma(auVar100,auVar43,auVar98);
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar1),auVar43,auVar102);
      auVar43 = vfmadd213ps_avx512vl(ZEXT1632(auVar1),auVar43,auVar42);
      auVar46 = ZEXT1632(auVar34);
      auVar43 = vfmadd213ps_avx512vl(auVar43,auVar46,auVar44);
      auVar1 = vfmadd213ps_fma(auVar43,auVar46,auVar88);
      auVar1 = vfmadd213ps_fma(ZEXT1632(auVar1),
                               ZEXT1632(CONCAT412(auVar34._12_4_ * auVar34._12_4_,
                                                  CONCAT48(auVar34._8_4_ * auVar34._8_4_,
                                                           CONCAT44(auVar34._4_4_ * auVar34._4_4_,
                                                                    auVar34._0_4_ * auVar34._0_4_)))
                                       ),auVar46);
      auVar44._0_4_ = auVar1._0_4_ + 1.0;
      auVar44._4_4_ = auVar1._4_4_ + 1.0;
      auVar44._8_4_ = auVar1._8_4_ + 1.0;
      auVar44._12_4_ = auVar1._12_4_ + 1.0;
      auVar44._16_4_ = 0x3f800000;
      auVar44._20_4_ = 0x3f800000;
      auVar44._24_4_ = 0x3f800000;
      auVar44._28_4_ = 0x3f800000;
      auVar74._0_4_ = (int)auVar50._0_4_;
      auVar74._4_4_ = (int)auVar50._4_4_;
      auVar74._8_4_ = (int)auVar50._8_4_;
      auVar74._12_4_ = (int)auVar50._12_4_;
      auVar74._16_4_ = (int)auVar50._16_4_;
      auVar74._20_4_ = (int)auVar50._20_4_;
      auVar74._24_4_ = (int)auVar50._24_4_;
      auVar74._28_4_ = (int)auVar50._28_4_;
      auVar43 = vpslld_avx2(auVar74,0x17);
      auVar43 = vpaddd_avx512vl(auVar43,auVar45);
      auVar1 = vfmadd213ps_fma(auVar43,auVar44,auVar92);
      auVar43 = vdivps_avx(auVar92,ZEXT1632(auVar1));
      auVar43 = vfnmadd213ps_avx512vl(auVar43,auVar82,auVar41);
      auVar42._4_4_ = auVar43._4_4_ * auVar2._4_4_;
      auVar42._0_4_ = auVar43._0_4_ * auVar2._0_4_;
      auVar42._8_4_ = auVar43._8_4_ * auVar2._8_4_;
      auVar42._12_4_ = auVar43._12_4_ * auVar2._12_4_;
      auVar42._16_4_ = auVar43._16_4_ * auVar2._16_4_;
      auVar42._20_4_ = auVar43._20_4_ * auVar2._20_4_;
      auVar42._24_4_ = auVar43._24_4_ * auVar2._24_4_;
      auVar42._28_4_ = auVar2._28_4_;
      *(undefined1 (*) [32])*pauVar28 = auVar42;
      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
    }
    for (; iVar29 + 3 < iVar27; iVar29 = iVar29 + 4) {
      auVar1 = *(undefined1 (*) [16])*pauVar28;
      auVar83._8_4_ = 0x42b0c0a5;
      auVar83._0_8_ = 0x42b0c0a542b0c0a5;
      auVar83._12_4_ = 0x42b0c0a5;
      auVar34 = vminps_avx(auVar1,auVar83);
      auVar85._8_4_ = 0xc2b0c0a5;
      auVar85._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar85._12_4_ = 0xc2b0c0a5;
      auVar37 = vmaxps_avx(auVar34,auVar85);
      auVar87._8_4_ = 0x3fb8aa3b;
      auVar87._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar87._12_4_ = 0x3fb8aa3b;
      auVar89._8_4_ = 0x3f000000;
      auVar89._0_8_ = 0x3f0000003f000000;
      auVar89._12_4_ = 0x3f000000;
      auVar32 = vfmadd213ps_fma(auVar87,auVar37,auVar89);
      auVar75._0_4_ = (int)auVar32._0_4_;
      auVar75._4_4_ = (int)auVar32._4_4_;
      auVar75._8_4_ = (int)auVar32._8_4_;
      auVar75._12_4_ = (int)auVar32._12_4_;
      auVar34 = vcvtdq2ps_avx(auVar75);
      uVar5 = vcmpps_avx512vl(auVar32,auVar34,1);
      auVar91._8_4_ = 0x3f800000;
      auVar91._0_8_ = 0x3f8000003f800000;
      auVar91._12_4_ = 0x3f800000;
      auVar32 = vsubps_avx512vl(auVar34,auVar91);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar36._0_4_ = (float)((uint)bVar3 * auVar32._0_4_ | (uint)!bVar3 * auVar34._0_4_);
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar36._4_4_ = (float)((uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * auVar34._4_4_);
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar36._8_4_ = (float)((uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * auVar34._8_4_);
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar36._12_4_ = (float)((uint)bVar3 * auVar32._12_4_ | (uint)!bVar3 * auVar34._12_4_);
      auVar93._8_4_ = 0x3f318000;
      auVar93._0_8_ = 0x3f3180003f318000;
      auVar93._12_4_ = 0x3f318000;
      auVar34 = vfmsub231ps_fma(auVar37,auVar36,auVar93);
      auVar95._8_4_ = 0xb95e8083;
      auVar95._0_8_ = 0xb95e8083b95e8083;
      auVar95._12_4_ = 0xb95e8083;
      auVar37 = vfnmsub231ps_fma(auVar34,auVar36,auVar95);
      auVar67._0_4_ = auVar37._0_4_ * auVar37._0_4_;
      auVar67._4_4_ = auVar37._4_4_ * auVar37._4_4_;
      auVar67._8_4_ = auVar37._8_4_ * auVar37._8_4_;
      auVar67._12_4_ = auVar37._12_4_ * auVar37._12_4_;
      auVar99._8_4_ = 0x39506967;
      auVar99._0_8_ = 0x3950696739506967;
      auVar99._12_4_ = 0x39506967;
      auVar97._8_4_ = 0x3ab743ce;
      auVar97._0_8_ = 0x3ab743ce3ab743ce;
      auVar97._12_4_ = 0x3ab743ce;
      auVar34 = vfmadd213ps_fma(auVar99,auVar37,auVar97);
      auVar101._8_4_ = 0x3c088908;
      auVar101._0_8_ = 0x3c0889083c088908;
      auVar101._12_4_ = 0x3c088908;
      auVar34 = vfmadd213ps_fma(auVar34,auVar37,auVar101);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar37,auVar33);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar37,auVar35);
      auVar34 = vfmadd213ps_fma(auVar34,auVar37,auVar89);
      auVar34 = vfmadd213ps_fma(auVar34,auVar67,auVar37);
      auVar64._0_4_ = auVar34._0_4_ + 1.0;
      auVar64._4_4_ = auVar34._4_4_ + 1.0;
      auVar64._8_4_ = auVar34._8_4_ + 1.0;
      auVar64._12_4_ = auVar34._12_4_ + 1.0;
      auVar68._0_4_ = (int)auVar36._0_4_;
      auVar68._4_4_ = (int)auVar36._4_4_;
      auVar68._8_4_ = (int)auVar36._8_4_;
      auVar68._12_4_ = (int)auVar36._12_4_;
      auVar34 = vpslld_avx(auVar68,0x17);
      auVar36 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar34 = vpaddd_avx512vl(auVar34,auVar36);
      auVar34 = vfmadd213ps_fma(auVar34,auVar64,auVar91);
      uVar5 = vcmpps_avx512vl(auVar34,_DAT_005379d0,2);
      auVar37._8_4_ = 0x800000;
      auVar37._0_8_ = 0x80000000800000;
      auVar37._12_4_ = 0x800000;
      auVar37 = vmaxps_avx512vl(auVar34,auVar37);
      auVar69 = vpsrld_avx(auVar37,0x17);
      auVar76._8_4_ = 0x807fffff;
      auVar76._0_8_ = 0x807fffff807fffff;
      auVar76._12_4_ = 0x807fffff;
      auVar34._8_4_ = 0x3f000000;
      auVar34._0_8_ = 0x3f0000003f000000;
      auVar34._12_4_ = 0x3f000000;
      auVar34 = vpternlogd_avx512vl(auVar37,auVar76,auVar34,0xea);
      auVar32._8_4_ = 0x3f3504f3;
      auVar32._0_8_ = 0x3f3504f33f3504f3;
      auVar32._12_4_ = 0x3f3504f3;
      uVar6 = vcmpps_avx512vl(auVar34,auVar32,1);
      auVar7._8_4_ = 0xbf800000;
      auVar7._0_8_ = 0xbf800000bf800000;
      auVar7._12_4_ = 0xbf800000;
      auVar37 = vaddps_avx512vl(auVar34,auVar7);
      auVar34 = vaddps_avx512vl(auVar37,auVar34);
      bVar3 = (bool)((byte)uVar6 & 1);
      auVar38._0_4_ = (float)((uint)bVar3 * auVar34._0_4_ | (uint)!bVar3 * auVar37._0_4_);
      bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar38._4_4_ = (float)((uint)bVar3 * auVar34._4_4_ | (uint)!bVar3 * auVar37._4_4_);
      bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar38._8_4_ = (float)((uint)bVar3 * auVar34._8_4_ | (uint)!bVar3 * auVar37._8_4_);
      bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar38._12_4_ = (float)((uint)bVar3 * auVar34._12_4_ | (uint)!bVar3 * auVar37._12_4_);
      auVar65._0_4_ = auVar38._0_4_ * auVar38._0_4_;
      auVar65._4_4_ = auVar38._4_4_ * auVar38._4_4_;
      auVar65._8_4_ = auVar38._8_4_ * auVar38._8_4_;
      auVar65._12_4_ = auVar38._12_4_ * auVar38._12_4_;
      auVar79._8_4_ = 0x3d9021bb;
      auVar79._0_8_ = 0x3d9021bb3d9021bb;
      auVar79._12_4_ = 0x3d9021bb;
      auVar8._8_4_ = 0xbdebd1b8;
      auVar8._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar8._12_4_ = 0xbdebd1b8;
      auVar34 = vfmadd213ps_avx512vl(auVar79,auVar38,auVar8);
      auVar9._8_4_ = 0x3def251a;
      auVar9._0_8_ = 0x3def251a3def251a;
      auVar9._12_4_ = 0x3def251a;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar9);
      auVar10._8_4_ = 0xbdfe5d4f;
      auVar10._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar10._12_4_ = 0xbdfe5d4f;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar10);
      auVar11._8_4_ = 0x3e11e9bf;
      auVar11._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar11._12_4_ = 0x3e11e9bf;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar11);
      auVar12._8_4_ = 0xbe2aae50;
      auVar12._0_8_ = 0xbe2aae50be2aae50;
      auVar12._12_4_ = 0xbe2aae50;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar12);
      auVar13._8_4_ = 0x3e4cceac;
      auVar13._0_8_ = 0x3e4cceac3e4cceac;
      auVar13._12_4_ = 0x3e4cceac;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar13);
      auVar14._8_4_ = 0xbe7ffffc;
      auVar14._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar14._12_4_ = 0xbe7ffffc;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar14);
      auVar15._8_4_ = 0x3eaaaaaa;
      auVar15._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar15._12_4_ = 0x3eaaaaaa;
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar38,auVar15);
      auVar80._0_4_ = auVar65._0_4_ * auVar38._0_4_ * auVar34._0_4_;
      auVar80._4_4_ = auVar65._4_4_ * auVar38._4_4_ * auVar34._4_4_;
      auVar80._8_4_ = auVar65._8_4_ * auVar38._8_4_ * auVar34._8_4_;
      auVar80._12_4_ = auVar65._12_4_ * auVar38._12_4_ * auVar34._12_4_;
      auVar16._8_4_ = 0xffffff82;
      auVar16._0_8_ = 0xffffff82ffffff82;
      auVar16._12_4_ = 0xffffff82;
      auVar34 = vpaddd_avx512vl(auVar69,auVar16);
      auVar34 = vcvtdq2ps_avx(auVar34);
      auVar37 = vsubps_avx512vl(auVar34,auVar91);
      bVar3 = (bool)((byte)uVar6 & 1);
      auVar69._0_4_ = (uint)bVar3 * auVar37._0_4_ | (uint)!bVar3 * auVar34._0_4_;
      bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
      auVar69._4_4_ = (uint)bVar3 * auVar37._4_4_ | (uint)!bVar3 * auVar34._4_4_;
      bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
      auVar69._8_4_ = (uint)bVar3 * auVar37._8_4_ | (uint)!bVar3 * auVar34._8_4_;
      bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
      auVar69._12_4_ = (uint)bVar3 * auVar37._12_4_ | (uint)!bVar3 * auVar34._12_4_;
      auVar34 = vfmadd231ps_fma(auVar80,auVar69,auVar95);
      auVar34 = vfmsub231ps_fma(auVar34,auVar89,auVar65);
      auVar34 = vsubps_avx(auVar34,auVar38);
      auVar34 = vfnmadd231ps_fma(auVar34,auVar93,auVar69);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar39._0_4_ =
           (uint)bVar3 * auVar37._0_4_ | (uint)!bVar3 * (int)(auVar34._0_4_ + auVar34._0_4_);
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar39._4_4_ =
           (uint)bVar3 * auVar37._4_4_ | (uint)!bVar3 * (int)(auVar34._4_4_ + auVar34._4_4_);
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar39._8_4_ =
           (uint)bVar3 * auVar37._8_4_ | (uint)!bVar3 * (int)(auVar34._8_4_ + auVar34._8_4_);
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar39._12_4_ =
           (uint)bVar3 * auVar37._12_4_ | (uint)!bVar3 * (int)(auVar34._12_4_ + auVar34._12_4_);
      auVar34 = vminps_avx(auVar39,auVar83);
      auVar37 = vmaxps_avx(auVar34,auVar85);
      auVar32 = vfmadd213ps_fma(auVar87,auVar37,auVar89);
      auVar77._0_4_ = (int)auVar32._0_4_;
      auVar77._4_4_ = (int)auVar32._4_4_;
      auVar77._8_4_ = (int)auVar32._8_4_;
      auVar77._12_4_ = (int)auVar32._12_4_;
      auVar34 = vcvtdq2ps_avx(auVar77);
      uVar5 = vcmpps_avx512vl(auVar32,auVar34,1);
      auVar32 = vsubps_avx512vl(auVar34,auVar91);
      bVar3 = (bool)((byte)uVar5 & 1);
      auVar40._0_4_ = (float)((uint)bVar3 * auVar32._0_4_ | (uint)!bVar3 * auVar34._0_4_);
      bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
      auVar40._4_4_ = (float)((uint)bVar3 * auVar32._4_4_ | (uint)!bVar3 * auVar34._4_4_);
      bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
      auVar40._8_4_ = (float)((uint)bVar3 * auVar32._8_4_ | (uint)!bVar3 * auVar34._8_4_);
      bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
      auVar40._12_4_ = (float)((uint)bVar3 * auVar32._12_4_ | (uint)!bVar3 * auVar34._12_4_);
      auVar34 = vfmsub231ps_fma(auVar37,auVar40,auVar93);
      auVar37 = vfnmsub231ps_fma(auVar34,auVar40,auVar95);
      auVar70._0_4_ = auVar37._0_4_ * auVar37._0_4_;
      auVar70._4_4_ = auVar37._4_4_ * auVar37._4_4_;
      auVar70._8_4_ = auVar37._8_4_ * auVar37._8_4_;
      auVar70._12_4_ = auVar37._12_4_ * auVar37._12_4_;
      auVar34 = vfmadd213ps_fma(auVar99,auVar37,auVar97);
      auVar34 = vfmadd213ps_fma(auVar34,auVar37,auVar101);
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar37,auVar33);
      auVar34 = vfmadd213ps_avx512vl(auVar34,auVar37,auVar35);
      auVar34 = vfmadd213ps_fma(auVar34,auVar37,auVar89);
      auVar34 = vfmadd213ps_fma(auVar34,auVar70,auVar37);
      auVar33._0_4_ = auVar34._0_4_ + 1.0;
      auVar33._4_4_ = auVar34._4_4_ + 1.0;
      auVar33._8_4_ = auVar34._8_4_ + 1.0;
      auVar33._12_4_ = auVar34._12_4_ + 1.0;
      auVar71._0_4_ = (int)auVar40._0_4_;
      auVar71._4_4_ = (int)auVar40._4_4_;
      auVar71._8_4_ = (int)auVar40._8_4_;
      auVar71._12_4_ = (int)auVar40._12_4_;
      auVar34 = vpslld_avx(auVar71,0x17);
      auVar34 = vpaddd_avx512vl(auVar34,auVar36);
      auVar34 = vfmadd213ps_fma(auVar34,auVar33,auVar91);
      auVar35._8_4_ = 0x40000000;
      auVar35._0_8_ = 0x4000000040000000;
      auVar35._12_4_ = 0x40000000;
      auVar34 = vdivps_avx(auVar35,auVar34);
      auVar1 = vfmsub213ps_fma(auVar34,auVar1,auVar1);
      *(undefined1 (*) [16])*pauVar28 = auVar1;
      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
    }
    for (; iVar29 < iVar27; iVar29 = iVar29 + 1) {
      __x = *(float *)*pauVar28;
      fVar63 = expf(__x);
      fVar63 = logf(fVar63 + 1.0);
      fVar63 = tanhf(fVar63);
      *(float *)*pauVar28 = fVar63 * __x;
      pauVar28 = (undefined1 (*) [64])(*pauVar28 + 4);
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = mish_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}